

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O0

int Cec_ManPatCollectTry(Vec_Ptr_t *vInfo,Vec_Ptr_t *vPres,int iBit,int *pLits,int nLits)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  int local_4c;
  int i;
  uint *pPres;
  uint *pInfo;
  int nLits_local;
  int *pLits_local;
  int iBit_local;
  Vec_Ptr_t *vPres_local;
  Vec_Ptr_t *vInfo_local;
  
  local_4c = 0;
  do {
    if (nLits <= local_4c) {
      for (local_4c = 0; local_4c < nLits; local_4c = local_4c + 1) {
        iVar1 = Abc_Lit2Var(pLits[local_4c]);
        puVar3 = (uint *)Vec_PtrEntry(vInfo,iVar1);
        iVar1 = Abc_Lit2Var(pLits[local_4c]);
        puVar4 = (uint *)Vec_PtrEntry(vPres,iVar1);
        Abc_InfoSetBit(puVar4,iBit);
        iVar1 = Abc_InfoHasBit(puVar3,iBit);
        iVar2 = Abc_LitIsCompl(pLits[local_4c]);
        if (iVar1 == iVar2) {
          Abc_InfoXorBit(puVar3,iBit);
        }
      }
      return 1;
    }
    iVar1 = Abc_Lit2Var(pLits[local_4c]);
    puVar3 = (uint *)Vec_PtrEntry(vInfo,iVar1);
    iVar1 = Abc_Lit2Var(pLits[local_4c]);
    puVar4 = (uint *)Vec_PtrEntry(vPres,iVar1);
    iVar1 = Abc_InfoHasBit(puVar4,iBit);
    if (iVar1 != 0) {
      iVar1 = Abc_InfoHasBit(puVar3,iBit);
      iVar2 = Abc_LitIsCompl(pLits[local_4c]);
      if (iVar1 == iVar2) {
        return 0;
      }
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

int Cec_ManPatCollectTry( Vec_Ptr_t * vInfo, Vec_Ptr_t * vPres, int iBit, int * pLits, int nLits )
{
    unsigned * pInfo, * pPres;
    int i;
    for ( i = 0; i < nLits; i++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry(vInfo, Abc_Lit2Var(pLits[i]));
        pPres = (unsigned *)Vec_PtrEntry(vPres, Abc_Lit2Var(pLits[i]));
        if ( Abc_InfoHasBit( pPres, iBit ) && 
             Abc_InfoHasBit( pInfo, iBit ) == Abc_LitIsCompl(pLits[i]) )
             return 0;
    }
    for ( i = 0; i < nLits; i++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry(vInfo, Abc_Lit2Var(pLits[i]));
        pPres = (unsigned *)Vec_PtrEntry(vPres, Abc_Lit2Var(pLits[i]));
        Abc_InfoSetBit( pPres, iBit );
        if ( Abc_InfoHasBit( pInfo, iBit ) == Abc_LitIsCompl(pLits[i]) )
            Abc_InfoXorBit( pInfo, iBit );
    }
    return 1;
}